

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O1

string * __thiscall
soul::PaddedStringTable::getCell_abi_cxx11_(PaddedStringTable *this,size_t row,size_t column)

{
  if (row < *(ulong *)&this->field_0x10) {
    if (column < *(ulong *)(*(long *)&this->rows + 8 + row * 0x118)) {
      return (string *)(column * 0x20 + *(long *)(*(long *)&this->rows + row * 0x118));
    }
  }
  throwInternalCompilerError("index < numActive","operator[]",0x9e);
}

Assistant:

std::string& PaddedStringTable::getCell (size_t row, size_t column)
{
    return rows[row][column];
}